

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

TFad<6,_double> * __thiscall TPZTensor<TFad<6,_double>_>::Norm(TPZTensor<TFad<6,_double>_> *this)

{
  TFad<6,_double> *this_00;
  TFad<6,_double> *x;
  long in_RSI;
  TFad<6,_double> *in_RDI;
  uint i;
  TFad<6,_double> norm;
  double *in_stack_fffffffffffffeb8;
  TFad<6,_double> *in_stack_fffffffffffffec0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *in_stack_fffffffffffffec8;
  TFad<6,_double> *in_stack_fffffffffffffed0;
  TFad<6,_double> *in_stack_fffffffffffffee8;
  TFad<6,_double> *in_stack_fffffffffffffef0;
  TFad<6,_double> *e1;
  TFad<6,_double> *in_stack_ffffffffffffff18;
  undefined4 local_5c;
  
  e1 = in_RDI;
  TFad<6,_double>::TFad(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
    in_stack_fffffffffffffef0 =
         TPZVec<TFad<6,_double>_>::operator[]
                   ((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),(ulong)local_5c);
    in_stack_fffffffffffffee8 =
         TPZVec<TFad<6,_double>_>::operator[]
                   ((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),(ulong)local_5c);
    ::operator*(e1,in_stack_fffffffffffffef0);
    TFad<6,double>::operator+=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
              ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bb644);
  }
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  ::operator*(e1,in_stack_fffffffffffffef0);
  TFad<6,double>::operator+=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bb70a);
  this_00 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  x = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  ::operator*(e1,in_stack_fffffffffffffef0);
  TFad<6,double>::operator+=
            (this_00,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)x);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bb77b);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  ::operator*(e1,in_stack_fffffffffffffef0);
  TFad<6,double>::operator+=
            (this_00,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)x);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bb7ea);
  sqrt<double,6>(in_stack_ffffffffffffff18);
  TFad<6,double>::TFad<TFadFuncSqrt<TFad<6,double>>>
            (in_stack_fffffffffffffef0,
             (TFadExpr<TFadFuncSqrt<TFad<6,_double>_>_> *)in_stack_fffffffffffffee8);
  TFadExpr<TFadFuncSqrt<TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadFuncSqrt<TFad<6,_double>_>_> *)0x14bb819);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14bb826);
  return in_RDI;
}

Assistant:

T TPZTensor<T>::Norm() const {
    T norm = T(0.);
    for (unsigned int i = 0; i < 6; i++) {
        norm += fData[i] * fData[i];
    }
    norm += fData[_XY_] * fData[_XY_];
    norm += fData[_XZ_] * fData[_XZ_];
    norm += fData[_YZ_] * fData[_YZ_];
    return sqrt(norm);
}